

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::TokenManager::ParsePrivateKey
          (Error *__return_storage_ptr__,TokenManager *this,mbedtls_pk_context_conflict *aPrivateKey
          ,ByteArray *aPrivateKeyRaw)

{
  ByteArray *pk;
  bool bVar1;
  uchar *key;
  size_type keylen;
  string *aErrorMessage;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view fmt;
  Error local_198;
  Error local_170;
  int local_144;
  int fail;
  anon_class_1_0_00000001 local_12a;
  v10 local_129;
  v10 *local_128;
  size_t local_120;
  string local_118;
  Error local_f8;
  undefined1 local_c9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c8;
  ByteArray *aPrivateKeyRaw_local;
  mbedtls_pk_context_conflict *aPrivateKey_local;
  TokenManager *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  local_c9 = 0;
  local_c8 = aPrivateKeyRaw;
  aPrivateKeyRaw_local = (ByteArray *)aPrivateKey;
  aPrivateKey_local = (mbedtls_pk_context_conflict *)this;
  this_local = (TokenManager *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(local_c8);
  pk = aPrivateKeyRaw_local;
  if (bVar1) {
    ParsePrivateKey::anon_class_1_0_00000001::operator()(&local_12a);
    local_58 = &local_128;
    local_60 = &local_129;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_120 = bVar2.size_;
    local_128 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_118;
    local_78 = local_128;
    sStack_70 = local_120;
    local_50 = &local_78;
    local_88 = local_128;
    local_80 = local_120;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_118,local_88,fmt,args);
    Error::Error(&local_f8,kInvalidArgs,&local_118);
    Error::operator=(__return_storage_ptr__,&local_f8);
    Error::~Error(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
  }
  else {
    key = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c8);
    keylen = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_c8);
    local_144 = mbedtls_pk_parse_key
                          ((mbedtls_pk_context *)pk,key,keylen,(uchar *)0x0,0,
                           mbedtls_ctr_drbg_random,&this->mCtrDrbg);
    if (local_144 != 0) {
      ErrorFromMbedtlsError(&local_170,local_144);
      Error::operator=(__return_storage_ptr__,&local_170);
      Error::~Error(&local_170);
      aErrorMessage = Error::GetMessage_abi_cxx11_(__return_storage_ptr__);
      Error::Error(&local_198,kInvalidArgs,aErrorMessage);
      Error::operator=(__return_storage_ptr__,&local_198);
      Error::~Error(&local_198);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ParsePrivateKey(mbedtls_pk_context &aPrivateKey, const ByteArray &aPrivateKeyRaw)
{
    Error error;

    VerifyOrExit(!aPrivateKeyRaw.empty(), error = ERROR_INVALID_ARGS("the raw private key is empty"));
    if (int fail = mbedtls_pk_parse_key(&aPrivateKey, aPrivateKeyRaw.data(), aPrivateKeyRaw.size(), nullptr, 0,
                                        mbedtls_ctr_drbg_random, &mCtrDrbg))
    {
        error = ErrorFromMbedtlsError(fail);
        ExitNow(error = {ErrorCode::kInvalidArgs, error.GetMessage()});
    }

exit:
    return error;
}